

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DropTrigger(Parse *pParse,SrcList *pName,int noErr)

{
  byte bVar1;
  uint uVar2;
  sqlite3 *db;
  char *zDb;
  char *pKey;
  Db *pDVar3;
  int iVar4;
  uint uVar5;
  HashElem *pHVar6;
  long lVar7;
  uint uVar8;
  
  db = pParse->db;
  if ((db->mallocFailed == '\0') && (iVar4 = sqlite3ReadSchema(pParse), iVar4 == 0)) {
    zDb = pName->a[0].zDatabase;
    uVar2 = db->nDb;
    if (0 < (int)uVar2) {
      pKey = pName->a[0].zName;
      pDVar3 = db->aDb;
      uVar8 = 0;
      do {
        uVar5 = uVar8 < 2 ^ uVar8;
        if (zDb != (char *)0x0) {
          lVar7 = 0;
          do {
            bVar1 = pDVar3[uVar5].zDbSName[lVar7];
            if (bVar1 == zDb[lVar7]) {
              if ((ulong)bVar1 == 0) break;
            }
            else if (""[bVar1] != ""[(byte)zDb[lVar7]]) goto LAB_0019187d;
            lVar7 = lVar7 + 1;
          } while( true );
        }
        pHVar6 = findElementWithHash(&(pDVar3[uVar5].pSchema)->trigHash,pKey,(uint *)0x0);
        if ((Trigger *)pHVar6->data != (Trigger *)0x0) {
          sqlite3DropTriggerPtr(pParse,(Trigger *)pHVar6->data);
          goto LAB_001918d7;
        }
LAB_0019187d:
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar2);
    }
    if (noErr == 0) {
      sqlite3ErrorMsg(pParse,"no such trigger: %S",pName,0);
    }
    else {
      sqlite3CodeVerifyNamedSchema(pParse,zDb);
    }
    pParse->checkSchema = '\x01';
  }
LAB_001918d7:
  sqlite3SrcListDelete(db,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTrigger(Parse *pParse, SrcList *pName, int noErr){
  Trigger *pTrigger = 0;
  int i;
  const char *zDb;
  const char *zName;
  sqlite3 *db = pParse->db;

  if( db->mallocFailed ) goto drop_trigger_cleanup;
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto drop_trigger_cleanup;
  }

  assert( pName->nSrc==1 );
  zDb = pName->a[0].zDatabase;
  zName = pName->a[0].zName;
  assert( zDb!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;  /* Search TEMP before MAIN */
    if( zDb && sqlite3StrICmp(db->aDb[j].zDbSName, zDb) ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    pTrigger = sqlite3HashFind(&(db->aDb[j].pSchema->trigHash), zName);
    if( pTrigger ) break;
  }
  if( !pTrigger ){
    if( !noErr ){
      sqlite3ErrorMsg(pParse, "no such trigger: %S", pName, 0);
    }else{
      sqlite3CodeVerifyNamedSchema(pParse, zDb);
    }
    pParse->checkSchema = 1;
    goto drop_trigger_cleanup;
  }
  sqlite3DropTriggerPtr(pParse, pTrigger);

drop_trigger_cleanup:
  sqlite3SrcListDelete(db, pName);
}